

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
base64_decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
             string *encoded_string)

{
  value_type_conflict1 vVar1;
  size_t sVar2;
  char *pcVar3;
  uchar *puVar4;
  value_type_conflict1 *pvVar5;
  size_t sVar6;
  bool local_61;
  value_type_conflict1 local_4e;
  value_type_conflict1 local_4d [13];
  undefined1 local_40;
  value_type_conflict1 local_3f [4];
  byte local_3b;
  byte local_3a;
  char local_39;
  uchar char_array_3 [3];
  long lStack_38;
  uchar char_array_4 [4];
  size_t in_;
  size_t j;
  size_t i;
  size_t in_len;
  string *encoded_string_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  
  i = std::__cxx11::string::size();
  j = 0;
  lStack_38 = 0;
  local_40 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  while( true ) {
    sVar2 = i - 1;
    local_61 = false;
    if (i != 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)encoded_string);
      local_61 = false;
      if (*pcVar3 != '=') {
        puVar4 = (uchar *)std::__cxx11::string::operator[]((ulong)encoded_string);
        local_61 = anon_unknown.dwarf_1b4ed::is_base64(*puVar4);
      }
    }
    if (local_61 == false) break;
    pvVar5 = (value_type_conflict1 *)std::__cxx11::string::operator[]((ulong)encoded_string);
    sVar6 = j + 1;
    local_3f[j + 3] = *pvVar5;
    lStack_38 = lStack_38 + 1;
    j = sVar6;
    i = sVar2;
    if (sVar6 == 4) {
      for (j = 0; j < 4; j = j + 1) {
        vVar1 = std::__cxx11::string::find(-0x48,(ulong)(uint)(int)(char)local_3f[j + 3]);
        local_3f[j + 3] = vVar1;
      }
      local_3f[0] = local_3f[3] * '\x04' + (char)((int)(local_3b & 0x30) >> 4);
      local_3f[1] = local_3b * '\x10' + (char)((int)(local_3a & 0x3c) >> 2);
      local_3f[2] = local_3a * '@' + local_39;
      for (j = 0; j < 3; j = j + 1) {
        local_4d[0] = local_3f[j];
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (__return_storage_ptr__,local_4d);
      }
      j = 0;
    }
  }
  if (j != 0) {
    for (in_ = 0; in_ < j; in_ = in_ + 1) {
      vVar1 = std::__cxx11::string::find(-0x48,(ulong)(uint)(int)(char)local_3f[in_ + 3]);
      local_3f[in_ + 3] = vVar1;
    }
    local_3f[0] = local_3f[3] * '\x04' + (char)((int)(local_3b & 0x30) >> 4);
    local_3f[1] = local_3b * '\x10' + (char)((int)(local_3a & 0x3c) >> 2);
    for (in_ = 0; in_ < j - 1; in_ = in_ + 1) {
      local_4e = local_3f[in_];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_4e);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> base64_decode(const std::string& encoded_string)
	{
		std::size_t in_len = encoded_string.size();
		std::size_t i = 0;
		std::size_t j = 0;
		std::size_t in_ = 0;
		unsigned char char_array_4[4], char_array_3[3];
		std::vector<uint8_t> ret;

		while (in_len-- && (encoded_string[in_] != '=') && is_base64(encoded_string[in_])) {
			char_array_4[i++] = encoded_string[in_]; in_++;
			if (i == 4) {
				for (i = 0; i < 4; i++)
					char_array_4[i] = (unsigned char)base64_chars.find(char_array_4[i]);

				char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
				char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
				char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

				for (i = 0; (i < 3); i++)
					ret.push_back((uint8_t)char_array_3[i]);
				i = 0;
			}
		}
		if (i) {
			for (j = 0; j < i; j++)
				char_array_4[j] = (unsigned char)base64_chars.find(char_array_4[j]);

			char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
			char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);

			for (j = 0; (j < i - 1); j++) ret.push_back((uint8_t)char_array_3[j]);
		}
		return ret;
	}